

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::Copy(aiTexture **_dest,aiTexture *src)

{
  aiTexel *__src;
  aiTexture *this;
  aiTexel *paVar1;
  uint local_2c;
  uint cpy;
  char *old;
  aiTexture *dest;
  aiTexture *src_local;
  aiTexture **_dest_local;
  
  if ((_dest != (aiTexture **)0x0) && (src != (aiTexture *)0x0)) {
    this = (aiTexture *)operator_new(0x428);
    aiTexture::aiTexture(this);
    *_dest = this;
    memcpy(this,src,0x428);
    __src = this->pcData;
    if (__src != (aiTexel *)0x0) {
      if (this->mHeight == 0) {
        local_2c = this->mWidth;
      }
      else {
        local_2c = this->mHeight * this->mWidth * 4;
      }
      if (local_2c == 0) {
        this->pcData = (aiTexel *)0x0;
      }
      else {
        paVar1 = (aiTexel *)operator_new__((ulong)local_2c);
        this->pcData = paVar1;
        memcpy(this->pcData,__src,(ulong)local_2c);
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiTexture** _dest, const aiTexture* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiTexture* dest = *_dest = new aiTexture();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiTexture));

    // and reallocate all arrays. We must do it manually here
    const char* old = (const char*)dest->pcData;
    if (old)
    {
        unsigned int cpy;
        if (!dest->mHeight)cpy = dest->mWidth;
        else cpy = dest->mHeight * dest->mWidth * sizeof(aiTexel);

        if (!cpy)
        {
            dest->pcData = NULL;
            return;
        }
        // the cast is legal, the aiTexel c'tor does nothing important
        dest->pcData = (aiTexel*) new char[cpy];
        ::memcpy(dest->pcData, old, cpy);
    }
}